

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystem.h
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::SetAcousticEmitterSystem
          (UnderwaterAcousticEmitterSystem *this,AcousticEmitterSystem *AES)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  
  KVar1 = AES->m_ui8Function;
  KVar2 = AES->m_ui8EmitterIDNumber;
  (this->m_AES).m_ui16EmitterName = AES->m_ui16EmitterName;
  (this->m_AES).m_ui8Function = KVar1;
  (this->m_AES).m_ui8EmitterIDNumber = KVar2;
  return;
}

Assistant:

class KDIS_EXPORT AcousticEmitterSystem : public DataTypeBase
{
protected:

    KUINT16 m_ui16EmitterName;

    KUINT8 m_ui8Function;

    KUINT8 m_ui8EmitterIDNumber;

public:

    static const KUINT16 ACOUSTIC_EMITTER_SYSTEM_SIZE = 4;

    AcousticEmitterSystem();

    AcousticEmitterSystem(KDataStream &stream) noexcept(false);

    AcousticEmitterSystem( KDIS::DATA_TYPE::ENUMS::AcousticSystemName ASN, KDIS::DATA_TYPE::ENUMS::AcousticSystemFunction ASF, KUINT8 ID );

    virtual ~AcousticEmitterSystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::AcousticEmitterSystem::SetName
    //              KDIS::DATA_TYPE::AcousticEmitterSystem::GetName
    // Description: Specifies the system for the particular emitter
    // Parameter:   AcousticSystemName ASN, void
    //************************************
    void SetName( KDIS::DATA_TYPE::ENUMS::AcousticSystemName ASN );
    KDIS::DATA_TYPE::ENUMS::AcousticSystemName GetName() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AcousticEmitterSystem::SetFunction
    //              KDIS::DATA_TYPE::AcousticEmitterSystem::GetFunction
    // Description: Specifies the function of the emitter system
    // Parameter:   AcousticSystemFunction ASF, void
    //************************************
    void SetFunction( KDIS::DATA_TYPE::ENUMS::AcousticSystemFunction ASF );
    KDIS::DATA_TYPE::ENUMS::AcousticSystemFunction GetFunction() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AcousticEmitterSystem::SetEmitterID
    //              KDIS::DATA_TYPE::AcousticEmitterSystem::GetEmitterID
    // Description: ID of the emitter. Used for identifying multiple emitters on a
    //              single entity. Numbering of systems shall begin with 1.
    // Parameter:   KUINT8 ID, void
    //************************************
    void SetEmitterID( KUINT8 ID );
    KUINT8 GetEmitterID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AcousticEmitterSystem::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::AcousticEmitterSystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::AcousticEmitterSystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const AcousticEmitterSystem & Value ) const;
    KBOOL operator != ( const AcousticEmitterSystem & Value ) const;
}